

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall
spdlog::logger::log_<fmt::v7::basic_string_view<char>,int_const&>
          (logger *this,source_loc loc,level_enum lvl,basic_string_view<char> *fmt,int *args)

{
  __int_type_conflict _Var1;
  int iVar2;
  pointer pcVar3;
  size_type sVar4;
  char *pcVar5;
  size_t sVar6;
  memory_buf_t buf;
  log_msg log_msg;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> local_1b0;
  log_msg local_90;
  
  iVar2 = (this->level_).super___atomic_base<int>._M_i;
  _Var1 = (this->tracer_).enabled_._M_base._M_i;
  if (((int)lvl < iVar2 & (_Var1 ^ 1U)) == 0) {
    local_1b0.super_buffer<char>.ptr_ = local_1b0.store_;
    local_1b0.super_buffer<char>.size_ = 0;
    local_1b0.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_00147ed0;
    local_1b0.super_buffer<char>.capacity_ = 0xfa;
    ::fmt::v7::format_to<fmt::v7::basic_string_view<char>,int_const&,250ul,char>
              (&local_1b0,fmt,args);
    sVar6 = local_1b0.super_buffer<char>.size_;
    pcVar5 = local_1b0.super_buffer<char>.ptr_;
    pcVar3 = (this->name_)._M_dataplus._M_p;
    sVar4 = (this->name_)._M_string_length;
    local_90.time.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_90.logger_name.data_ = pcVar3;
    local_90.logger_name.size_ = sVar4;
    local_90.level = lvl;
    local_90.thread_id = details::os::thread_id();
    local_90.color_range_start = 0;
    local_90.color_range_end = 0;
    local_90.source.filename = loc.filename;
    local_90.source.line = loc.line;
    local_90.source._12_4_ = loc._12_4_;
    local_90.source.funcname = loc.funcname;
    local_90.payload.data_ = pcVar5;
    local_90.payload.size_ = sVar6;
    log_it_(this,&local_90,iVar2 <= (int)lvl,(bool)(_Var1 & 1));
    ::fmt::v7::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::deallocate(&local_1b0);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, const FormatString &fmt, Args&&...args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
            fmt::format_to(buf, fmt, std::forward<Args>(args)...);
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }